

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O3

void av1_calc_proj_params_high_bd_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  int64_t aiVar11 [2];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar10 [64];
  undefined1 auVar17 [64];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    }
    else {
      lVar5 = (long)src8 * 2;
      lVar6 = (long)dat8 * 2;
      auVar10 = ZEXT1664((undefined1  [16])0x0);
      uVar4 = 0;
      auVar14 = ZEXT1664((undefined1  [16])0x0);
      do {
        if (0 < width) {
          lVar7 = 0;
          do {
            auVar9 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar6 + lVar7 * 2));
            auVar13 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar5 + lVar7 * 2));
            auVar20 = vpslld_avx2(auVar9,4);
            auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar7),auVar20);
            auVar9 = vpsubd_avx2(auVar13,auVar9);
            auVar12 = vpslld_avx2(auVar9,4);
            auVar9 = vpmuldq_avx2(auVar16,auVar16);
            auVar9 = vpaddq_avx2(auVar10._0_32_,auVar9);
            auVar20 = vpshufd_avx2(auVar16,0xf5);
            auVar13 = vpmuldq_avx2(auVar20,auVar20);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar10 = ZEXT3264(auVar9);
            auVar9 = vpmuldq_avx2(auVar12,auVar16);
            auVar9 = vpaddq_avx2(auVar14._0_32_,auVar9);
            auVar13 = vpsrlq_avx2(auVar12,0x20);
            auVar13 = vpmuldq_avx2(auVar13,auVar20);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar14 = ZEXT3264(auVar9);
            lVar7 = lVar7 + 8;
          } while (lVar7 < width);
        }
        auVar13 = auVar14._0_32_;
        auVar9 = auVar10._0_32_;
        uVar4 = uVar4 + 1;
        flt1 = flt1 + flt1_stride;
        lVar5 = lVar5 + (long)src_stride * 2;
        lVar6 = lVar6 + (long)dat_stride * 2;
      } while (uVar4 != (uint)height);
    }
    auVar1 = vpaddq_avx(auVar9._16_16_,auVar9._0_16_);
    auVar8 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddq_avx(auVar1,auVar8);
    auVar8 = vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
    auVar2 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpaddq_avx(auVar8,auVar2);
    auVar8 = vpslldq_avx(auVar8,8);
    aiVar11 = (int64_t  [2])vpslldq_avx(auVar1,8);
    *(undefined1 (*) [16])C = auVar8;
    H[1] = aiVar11;
    lVar5 = (long)(height * width);
    H[1][1] = auVar1._0_8_ / lVar5;
  }
  else {
    lVar5 = (long)src8 * 2;
    lVar6 = (long)dat8 * 2;
    if (params->r[1] < 1) {
      if (height < 1) {
        auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar10 = ZEXT1664((undefined1  [16])0x0);
        uVar4 = 0;
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        do {
          if (0 < width) {
            lVar7 = 0;
            do {
              auVar9 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar6 + lVar7 * 2));
              auVar13 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar5 + lVar7 * 2));
              auVar20 = vpslld_avx2(auVar9,4);
              auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar7),auVar20);
              auVar9 = vpsubd_avx2(auVar13,auVar9);
              auVar12 = vpslld_avx2(auVar9,4);
              auVar9 = vpmuldq_avx2(auVar16,auVar16);
              auVar9 = vpaddq_avx2(auVar10._0_32_,auVar9);
              auVar20 = vpshufd_avx2(auVar16,0xf5);
              auVar13 = vpmuldq_avx2(auVar20,auVar20);
              auVar9 = vpaddq_avx2(auVar13,auVar9);
              auVar10 = ZEXT3264(auVar9);
              auVar9 = vpmuldq_avx2(auVar12,auVar16);
              auVar9 = vpaddq_avx2(auVar14._0_32_,auVar9);
              auVar13 = vpsrlq_avx2(auVar12,0x20);
              auVar13 = vpmuldq_avx2(auVar13,auVar20);
              auVar9 = vpaddq_avx2(auVar13,auVar9);
              auVar14 = ZEXT3264(auVar9);
              lVar7 = lVar7 + 8;
            } while (lVar7 < width);
          }
          auVar13 = auVar14._0_32_;
          auVar9 = auVar10._0_32_;
          uVar4 = uVar4 + 1;
          flt0 = flt0 + flt0_stride;
          lVar5 = lVar5 + (long)src_stride * 2;
          lVar6 = lVar6 + (long)dat_stride * 2;
        } while (uVar4 != (uint)height);
      }
      auVar1 = vpaddq_avx(auVar9._16_16_,auVar9._0_16_);
      auVar8 = vpshufd_avx(auVar1,0xee);
      auVar1 = vpaddq_avx(auVar1,auVar8);
      auVar8 = vpaddq_avx(auVar13._16_16_,auVar13._0_16_);
      auVar2 = vpshufd_avx(auVar8,0xee);
      auVar8 = vpaddq_avx(auVar8,auVar2);
      *C = auVar8._0_8_;
      C[1] = 0;
      (*H)[0] = auVar1._0_8_;
      (*H)[1] = 0;
      lVar5 = (long)(height * width);
      (*H)[0] = auVar1._0_8_ / lVar5;
      goto LAB_00494bb5;
    }
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = auVar17._0_32_;
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar12 = auVar18._0_32_;
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = auVar14._0_32_;
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = auVar15._0_32_;
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    auVar9 = auVar10._0_32_;
    if (0 < height) {
      uVar4 = 0;
      do {
        if (0 < width) {
          lVar7 = 0;
          do {
            auVar9 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar6 + lVar7 * 2));
            auVar13 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar5 + lVar7 * 2));
            auVar20 = vpslld_avx2(auVar9,4);
            auVar9 = vpsubd_avx2(auVar13,auVar9);
            auVar19 = vpslld_avx2(auVar9,4);
            auVar12 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar7),auVar20);
            auVar3 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar7),auVar20);
            auVar9 = vpmuldq_avx2(auVar12,auVar12);
            auVar9 = vpaddq_avx2(auVar9,auVar10._0_32_);
            auVar20 = vpshufd_avx2(auVar12,0xf5);
            auVar13 = vpmuldq_avx2(auVar20,auVar20);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar10 = ZEXT3264(auVar9);
            auVar9 = vpmuldq_avx2(auVar3,auVar12);
            auVar9 = vpaddq_avx2(auVar9,auVar15._0_32_);
            auVar16 = vpshufd_avx2(auVar3,0xf5);
            auVar13 = vpmuldq_avx2(auVar16,auVar20);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar15 = ZEXT3264(auVar9);
            auVar9 = vpmuldq_avx2(auVar3,auVar3);
            auVar9 = vpaddq_avx2(auVar9,auVar14._0_32_);
            auVar13 = vpmuldq_avx2(auVar16,auVar16);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar14 = ZEXT3264(auVar9);
            auVar9 = vpmuldq_avx2(auVar19,auVar12);
            auVar9 = vpaddq_avx2(auVar18._0_32_,auVar9);
            auVar12 = vpshufd_avx2(auVar19,0xf5);
            auVar13 = vpmuldq_avx2(auVar12,auVar20);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar18 = ZEXT3264(auVar9);
            auVar9 = vpmuldq_avx2(auVar3,auVar19);
            auVar9 = vpaddq_avx2(auVar17._0_32_,auVar9);
            auVar13 = vpmuldq_avx2(auVar16,auVar12);
            auVar9 = vpaddq_avx2(auVar13,auVar9);
            auVar17 = ZEXT3264(auVar9);
            lVar7 = lVar7 + 8;
          } while (lVar7 < width);
        }
        auVar13 = auVar14._0_32_;
        auVar20 = auVar15._0_32_;
        auVar12 = auVar18._0_32_;
        auVar9 = auVar10._0_32_;
        auVar16 = auVar17._0_32_;
        uVar4 = uVar4 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar5 = lVar5 + (long)src_stride * 2;
        lVar6 = lVar6 + (long)dat_stride * 2;
      } while (uVar4 != (uint)height);
    }
    auVar3 = vpunpcklqdq_avx2(auVar12,auVar16);
    auVar16 = vpunpckhqdq_avx2(auVar12,auVar16);
    auVar16 = vpaddq_avx2(auVar3,auVar16);
    auVar1 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
    auVar16 = vpunpcklqdq_avx2(auVar9,auVar20);
    auVar9 = vpunpckhqdq_avx2(auVar9,auVar20);
    auVar9 = vpaddq_avx2(auVar16,auVar9);
    auVar8 = vpaddq_avx(auVar9._16_16_,auVar9._0_16_);
    auVar20 = vpslldq_avx2(auVar13,8);
    auVar9 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar13,0xcc);
    auVar9 = vpaddq_avx2(auVar20,auVar9);
    auVar2 = vpaddq_avx(auVar9._16_16_,auVar9._0_16_);
    *(undefined1 (*) [16])C = auVar1;
    lVar5 = (long)(height * width);
    (*H)[0] = auVar8._0_8_ / lVar5;
    lVar6 = vpextrq_avx(auVar8,1);
    (*H)[1] = lVar6 / lVar5;
    lVar7 = vpextrq_avx(auVar2,1);
    H[1][1] = lVar7 / lVar5;
    H[1][0] = lVar6 / lVar5;
    *C = *C / lVar5;
  }
  C = C + 1;
LAB_00494bb5:
  *C = *C / lVar5;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_avx2(const uint8_t *src8, int width,
                                       int height, int src_stride,
                                       const uint8_t *dat8, int dat_stride,
                                       int32_t *flt0, int flt0_stride,
                                       int32_t *flt1, int flt1_stride,
                                       int64_t H[2][2], int64_t C[2],
                                       const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_avx2(src8, width, height, src_stride, dat8,
                                        dat_stride, flt0, flt0_stride, flt1,
                                        flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_avx2(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_avx2(src8, width, height, src_stride, dat8,
                                     dat_stride, flt1, flt1_stride, H, C);
  }
}